

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O2

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::StartStateRowProbs::operator()
          (StartStateRowProbs *this,iterator_t *str,iterator_t *end)

{
  ParserDPOMDPFormat_Spirit *this_00;
  pointer pvVar1;
  pointer pdVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  StateDistributionVector *this_01;
  ostream *poVar6;
  E *pEVar7;
  char *local_1e0;
  string err;
  stringstream ss;
  ostream local_190 [376];
  
  this_00 = this->_m_po;
  if (this_00->_m_lp_type == UNIFORM) {
    MADPComponentDiscreteStates::SetUniformISD
              (&(this_00->_m_decPOMDPDiscrete->super_MultiAgentDecisionProcessDiscrete)._m_S);
    return;
  }
  bVar4 = IsRowMatrixLP(this_00);
  if (bVar4) {
    pvVar1 = (this->_m_po->_m_curMatrix).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar2 = *(pointer *)
              ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data + 8);
    lVar3 = *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data;
    lVar5 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                                   super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))();
    if ((long)pdVar2 - lVar3 >> 3 == lVar5) {
      this_01 = (StateDistributionVector *)operator_new(0x20);
      StateDistributionVector::StateDistributionVector
                (this_01,(this->_m_po->_m_curMatrix).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      MADPComponentDiscreteStates::SetISD
                (&(this->_m_po->_m_decPOMDPDiscrete->super_MultiAgentDecisionProcessDiscrete)._m_S,
                 (StateDistribution *)this_01);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"StartStateRowProbs: _m_po->_m_curMatrix",(allocator<char> *)&ss);
    std::__cxx11::string::append((char *)&err);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar6 = std::operator<<(local_190,"StartStateRowProbs: _m_po->_m_curMatrix[0] ");
    poVar6 = std::operator<<(poVar6,"should contain NrStates(=");
    (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                           super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess
                + 0x30))();
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,") entries! (not ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,")\n");
    pEVar7 = (E *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    E::E(pEVar7,local_1e0);
    __cxa_throw(pEVar7,&E::typeinfo,E::~E);
  }
  pEVar7 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar7,
       "StartStateRowProbs: _m_po->_m_curMatrix should                            be a row vector!")
  ;
  __cxa_throw(pEVar7,&E::typeinfo,E::~E);
}

Assistant:

void operator()(iterator_t str, iterator_t end) const            
            {
                if(_m_po->_m_lp_type == UNIFORM)
                {
                    _m_po->GetDecPOMDPDiscrete()->SetUniformISD();
                    return;
                }

                //check size - it should be a row matrix...
                if( !_m_po->IsRowMatrixLP() )        
                    throw E("StartStateRowProbs: _m_po->_m_curMatrix should \
                           be a row vector!");
                if(_m_po->_m_curMatrix[0].size() != _m_po->GetDecPOMDPDiscrete()->
                        GetNrStates())
                {
                    std::string err = "StartStateRowProbs: _m_po->_m_curMatrix";
                    err += " [0] should contain NrStates(="; 
                    std::stringstream ss;
                    ss << "StartStateRowProbs: _m_po->_m_curMatrix[0] " << 
                        "should contain NrStates(=" << _m_po->GetDecPOMDPDiscrete()->
                        GetNrStates() << ") entries! (not "<<
                        _m_po->_m_curMatrix[0].size()<<")\n";

                    throw E( ss.str().c_str() );
                }

                StateDistributionVector *isd=new StateDistributionVector(_m_po->_m_curMatrix[0]);
                _m_po->GetDecPOMDPDiscrete()->SetISD(isd);
            }